

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

void google::protobuf::compiler::cpp::GenerateUtf8CheckCode
               (FieldDescriptor *field,Options *options,bool for_parse,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,char *parameters,char *strict_function,char *verify_function,
               Printer *printer)

{
  char *pcVar1;
  Utf8CheckMode UVar2;
  string *psVar3;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  char *local_38;
  char *strict_function_local;
  char *parameters_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Options *pOStack_18;
  bool for_parse_local;
  Options *options_local;
  FieldDescriptor *field_local;
  
  local_38 = strict_function;
  strict_function_local = parameters;
  parameters_local = (char *)variables;
  variables_local._7_1_ = for_parse;
  pOStack_18 = options;
  options_local = (Options *)field;
  UVar2 = GetUtf8CheckMode(field,options);
  if (UVar2 == STRICT) {
    if ((variables_local._7_1_ & 1) != 0) {
      io::Printer::Print(printer,"DO_(");
    }
    pcVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
    io::Printer::Print(printer,"::google::protobuf::internal::WireFormatLite::$function$(\n",
                       "function",&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    io::Printer::Indent(printer);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)parameters_local,strict_function_local);
    if ((variables_local._7_1_ & 1) == 0) {
      io::Printer::Print(printer,"::google::protobuf::internal::WireFormatLite::SERIALIZE,\n");
    }
    else {
      io::Printer::Print(printer,"::google::protobuf::internal::WireFormatLite::PARSE,\n");
    }
    psVar3 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)options_local);
    io::Printer::Print(printer,"\"$full_name$\")","full_name",psVar3);
    if ((variables_local._7_1_ & 1) != 0) {
      io::Printer::Print(printer,")");
    }
    io::Printer::Print(printer,";\n");
    io::Printer::Outdent(printer);
  }
  else if (UVar2 == VERIFY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,verify_function,&local_91);
    io::Printer::Print(printer,"::google::protobuf::internal::WireFormat::$function$(\n","function",
                       &local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    io::Printer::Indent(printer);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)parameters_local,strict_function_local);
    if ((variables_local._7_1_ & 1) == 0) {
      io::Printer::Print(printer,"::google::protobuf::internal::WireFormat::SERIALIZE,\n");
    }
    else {
      io::Printer::Print(printer,"::google::protobuf::internal::WireFormat::PARSE,\n");
    }
    psVar3 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)options_local);
    io::Printer::Print(printer,"\"$full_name$\");\n","full_name",psVar3);
    io::Printer::Outdent(printer);
  }
  return;
}

Assistant:

static void GenerateUtf8CheckCode(const FieldDescriptor* field,
                                  const Options& options, bool for_parse,
                                  const std::map<string, string>& variables,
                                  const char* parameters,
                                  const char* strict_function,
                                  const char* verify_function,
                                  io::Printer* printer) {
  switch (GetUtf8CheckMode(field, options)) {
    case STRICT: {
      if (for_parse) {
        printer->Print("DO_(");
      }
      printer->Print(
          "::google::protobuf::internal::WireFormatLite::$function$(\n",
          "function", strict_function);
      printer->Indent();
      printer->Print(variables, parameters);
      if (for_parse) {
        printer->Print("::google::protobuf::internal::WireFormatLite::PARSE,\n");
      } else {
        printer->Print("::google::protobuf::internal::WireFormatLite::SERIALIZE,\n");
      }
      printer->Print("\"$full_name$\")", "full_name", field->full_name());
      if (for_parse) {
        printer->Print(")");
      }
      printer->Print(";\n");
      printer->Outdent();
      break;
    }
    case VERIFY: {
      printer->Print(
          "::google::protobuf::internal::WireFormat::$function$(\n",
          "function", verify_function);
      printer->Indent();
      printer->Print(variables, parameters);
      if (for_parse) {
        printer->Print("::google::protobuf::internal::WireFormat::PARSE,\n");
      } else {
        printer->Print("::google::protobuf::internal::WireFormat::SERIALIZE,\n");
      }
      printer->Print("\"$full_name$\");\n", "full_name", field->full_name());
      printer->Outdent();
      break;
    }
    case NONE:
      break;
  }
}